

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_alt.cc
# Opt level: O3

void * v2i_issuer_alt(X509V3_EXT_METHOD *method,X509V3_CTX *ctx,stack_st_CONF_VALUE *nval)

{
  int iVar1;
  OPENSSL_STACK *sk;
  size_t sVar2;
  CONF_VALUE *cnf;
  GENERAL_NAME *a;
  size_t sVar3;
  X509_EXTENSION *ext;
  OPENSSL_STACK *sk_00;
  void *p;
  size_t sVar4;
  char *method_00;
  
  sk = OPENSSL_sk_new_null();
  if (sk == (OPENSSL_STACK *)0x0) {
LAB_0022336a:
    sk = (OPENSSL_STACK *)0x0;
  }
  else {
    sVar2 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
    if (sVar2 != 0) {
      sVar2 = 0;
      do {
        cnf = (CONF_VALUE *)OPENSSL_sk_value((OPENSSL_STACK *)nval,sVar2);
        method_00 = "issuer";
        iVar1 = x509v3_conf_name_matches(cnf->name,"issuer");
        if ((iVar1 == 0) || (cnf->value == (char *)0x0)) {
LAB_0022322a:
          a = v2i_GENERAL_NAME_ex((GENERAL_NAME *)0x0,(X509V3_EXT_METHOD *)method_00,
                                  (X509V3_CTX *)ctx,cnf,0);
          if ((a == (GENERAL_NAME *)0x0) || (sVar3 = OPENSSL_sk_push(sk,a), sVar3 == 0)) {
            GENERAL_NAME_free(a);
LAB_00223354:
            OPENSSL_sk_pop_free_ex(sk,sk_GENERAL_NAME_call_free_func,GENERAL_NAME_free);
            goto LAB_0022336a;
          }
        }
        else {
          method_00 = "copy";
          iVar1 = strcmp(cnf->value,"copy");
          if (iVar1 != 0) goto LAB_0022322a;
          if (ctx == (X509V3_CTX *)0x0) {
LAB_00223336:
            ERR_put_error(0x14,0,0x8d,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                          ,0x108);
            goto LAB_00223354;
          }
          if (ctx->flags != 1) {
            if ((X509 *)ctx->issuer_cert == (X509 *)0x0) goto LAB_00223336;
            iVar1 = X509_get_ext_by_NID((X509 *)ctx->issuer_cert,0x55,-1);
            if (-1 < iVar1) {
              ext = X509_get_ext((X509 *)ctx->issuer_cert,iVar1);
              if ((ext == (X509_EXTENSION *)0x0) ||
                 (sk_00 = (OPENSSL_STACK *)X509V3_EXT_d2i(ext), sk_00 == (OPENSSL_STACK *)0x0)) {
                ERR_put_error(0x14,0,0x88,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_alt.cc"
                              ,0x115);
                sk_00 = (OPENSSL_STACK *)0x0;
LAB_0022332f:
                GENERAL_NAMES_free((GENERAL_NAMES *)sk_00);
                goto LAB_00223354;
              }
              sVar3 = OPENSSL_sk_num(sk_00);
              if (sVar3 != 0) {
                sVar3 = 0;
                do {
                  p = OPENSSL_sk_value(sk_00,sVar3);
                  sVar4 = OPENSSL_sk_push(sk,p);
                  if (sVar4 == 0) goto LAB_0022332f;
                  OPENSSL_sk_set(sk_00,sVar3,(void *)0x0);
                  sVar3 = sVar3 + 1;
                  sVar4 = OPENSSL_sk_num(sk_00);
                } while (sVar3 < sVar4);
              }
              GENERAL_NAMES_free((GENERAL_NAMES *)sk_00);
            }
          }
        }
        sVar2 = sVar2 + 1;
        sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)nval);
      } while (sVar2 < sVar3);
    }
  }
  return sk;
}

Assistant:

static void *v2i_issuer_alt(const X509V3_EXT_METHOD *method,
                            const X509V3_CTX *ctx,
                            const STACK_OF(CONF_VALUE) *nval) {
  GENERAL_NAMES *gens = sk_GENERAL_NAME_new_null();
  if (gens == NULL) {
    return NULL;
  }
  for (size_t i = 0; i < sk_CONF_VALUE_num(nval); i++) {
    const CONF_VALUE *cnf = sk_CONF_VALUE_value(nval, i);
    if (x509v3_conf_name_matches(cnf->name, "issuer") && cnf->value &&
        !strcmp(cnf->value, "copy")) {
      if (!copy_issuer(ctx, gens)) {
        goto err;
      }
    } else {
      GENERAL_NAME *gen = v2i_GENERAL_NAME(method, ctx, cnf);
      if (gen == NULL || !sk_GENERAL_NAME_push(gens, gen)) {
        GENERAL_NAME_free(gen);
        goto err;
      }
    }
  }
  return gens;
err:
  sk_GENERAL_NAME_pop_free(gens, GENERAL_NAME_free);
  return NULL;
}